

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window)

{
  float *pfVar1;
  ImVec2 IVar2;
  ImGuiContext *g;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar6 = (window->Scroll).x;
  fVar3 = (window->Scroll).y;
  fVar5 = (window->ScrollTarget).x;
  if (fVar5 < 3.4028235e+38) {
    fVar6 = (window->ScrollbarSizes).x;
    fVar7 = (window->ScrollTargetCenterRatio).x;
    fVar4 = (window->ScrollTargetEdgeSnapDist).x;
    if (0.0 < fVar4) {
      if (fVar5 <= fVar4) {
        fVar5 = fVar5 * fVar7 + 0.0;
      }
      else {
        fVar8 = ((window->ScrollMax).x + (window->SizeFull).x) - fVar6;
        if (fVar8 - fVar4 <= fVar5) {
          fVar5 = fVar5 + (fVar8 - fVar5) * fVar7;
        }
      }
    }
    fVar6 = fVar5 - fVar7 * ((window->SizeFull).x - fVar6);
  }
  pfVar1 = &(window->ScrollTarget).y;
  if (3.4028235e+38 < *pfVar1 || *pfVar1 == 3.4028235e+38) goto LAB_0011f37d;
  fVar5 = 0.0;
  if ((window->Flags & 1) == 0) {
    fVar5 = GImGui->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar5 = fVar5 * window->ParentWindow->FontWindowScale;
    }
    fVar3 = (GImGui->Style).FramePadding.y;
    fVar5 = fVar3 + fVar3 + fVar5;
  }
  fVar3 = ImGuiWindow::MenuBarHeight(window);
  fVar4 = fVar3 + fVar5 + (window->ScrollbarSizes).y;
  fVar3 = (window->ScrollTarget).y;
  fVar5 = (window->ScrollTargetCenterRatio).y;
  fVar7 = (window->ScrollTargetEdgeSnapDist).y;
  if (0.0 < fVar7) {
    if (fVar3 <= fVar7) {
      fVar3 = fVar3 * fVar5;
      fVar7 = 0.0;
    }
    else {
      fVar8 = ((window->ScrollMax).y + (window->SizeFull).y) - fVar4;
      if (fVar3 < fVar8 - fVar7) goto LAB_0011f362;
      fVar7 = (fVar8 - fVar3) * fVar5;
    }
    fVar3 = fVar3 + fVar7;
  }
LAB_0011f362:
  fVar3 = fVar3 - fVar5 * ((window->SizeFull).y - fVar4);
LAB_0011f37d:
  fVar6 = (float)(int)(float)(-(uint)(0.0 <= fVar6) & (uint)fVar6);
  fVar5 = (float)(int)(float)(-(uint)(0.0 <= fVar3) & (uint)fVar3);
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    fVar3 = (window->ScrollMax).x;
    if (fVar3 <= fVar6) {
      fVar6 = fVar3;
    }
    fVar3 = (window->ScrollMax).y;
    if (fVar3 <= fVar5) {
      fVar5 = fVar3;
    }
  }
  IVar2.y = fVar5;
  IVar2.x = fVar6;
  return IVar2;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window)
{
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float decoration_total_width = window->ScrollbarSizes.x;
        float center_x_ratio = window->ScrollTargetCenterRatio.x;
        float scroll_target_x = window->ScrollTarget.x;
        if (window->ScrollTargetEdgeSnapDist.x > 0.0f)
        {
            float snap_x_min = 0.0f;
            float snap_x_max = window->ScrollMax.x + window->SizeFull.x - decoration_total_width;
            scroll_target_x = CalcScrollEdgeSnap(scroll_target_x, snap_x_min, snap_x_max, window->ScrollTargetEdgeSnapDist.x, center_x_ratio);
        }
        scroll.x = scroll_target_x - center_x_ratio * (window->SizeFull.x - decoration_total_width);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        float decoration_total_height = window->TitleBarHeight() + window->MenuBarHeight() + window->ScrollbarSizes.y;
        float center_y_ratio = window->ScrollTargetCenterRatio.y;
        float scroll_target_y = window->ScrollTarget.y;
        if (window->ScrollTargetEdgeSnapDist.y > 0.0f)
        {
            float snap_y_min = 0.0f;
            float snap_y_max = window->ScrollMax.y + window->SizeFull.y - decoration_total_height;
            scroll_target_y = CalcScrollEdgeSnap(scroll_target_y, snap_y_min, snap_y_max, window->ScrollTargetEdgeSnapDist.y, center_y_ratio);
        }
        scroll.y = scroll_target_y - center_y_ratio * (window->SizeFull.y - decoration_total_height);
    }
    scroll.x = IM_FLOOR(ImMax(scroll.x, 0.0f));
    scroll.y = IM_FLOOR(ImMax(scroll.y, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}